

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

Type_Conversion chaiscript::base_class<std::exception,chaiscript::exception::arithmetic_error>(void)

{
  element_type *in_RDI;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> sVar1;
  Type_Conversion TVar2;
  
  sVar1 = make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Dynamic_Conversion_Impl<std::exception,chaiscript::exception::arithmetic_error>>
                    ();
  TVar2.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = sVar1.
                super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  TVar2.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (Type_Conversion)
         TVar2.
         super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Type_Conversion base_class() {
    // Can only be used with related polymorphic types
    // may be expanded some day to support conversions other than child -> parent
    static_assert(std::is_base_of<Base, Derived>::value, "Classes are not related by inheritance");

    if constexpr (std::is_polymorphic<Base>::value && std::is_polymorphic<Derived>::value) {
      return chaiscript::make_shared<detail::Type_Conversion_Base, detail::Dynamic_Conversion_Impl<Base, Derived>>();
    } else {
      return chaiscript::make_shared<detail::Type_Conversion_Base, detail::Static_Conversion_Impl<Base, Derived>>();
    }
  }